

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

bool __thiscall cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  unsigned_long uVar5;
  char *__s1;
  undefined8 uVar6;
  unsigned_long dindex;
  string next;
  Directory d;
  allocator local_92;
  allocator local_91;
  string local_90;
  Directory local_70;
  cmArchiveWrite *local_68;
  size_t local_60;
  char *local_58;
  string local_50;
  
  bVar2 = AddFile(this,path,skip,prefix);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_90,path,(allocator *)&local_70);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_90);
    bVar3 = true;
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_50,path,&local_91);
      bVar3 = cmsys::SystemTools::FileIsSymlink(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    bVar2 = true;
    if (bVar3 == false) {
      cmsys::Directory::Directory(&local_70);
      std::__cxx11::string::string((string *)&local_90,path,&local_92);
      bVar3 = cmsys::Directory::Load(&local_70,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
      if (bVar3) {
        std::__cxx11::string::string((string *)&local_90,path,&local_92);
        local_68 = this;
        local_60 = skip;
        local_58 = prefix;
        std::__cxx11::string::append((char *)&local_90);
        sVar1 = local_90._M_string_length;
        uVar5 = cmsys::Directory::GetNumberOfFiles(&local_70);
        if (uVar5 != 0) {
          dindex = 0;
          do {
            __s1 = cmsys::Directory::GetFile(&local_70,dindex);
            iVar4 = strcmp(__s1,".");
            if ((iVar4 != 0) && (iVar4 = strcmp(__s1,".."), iVar4 != 0)) {
              if (local_90._M_string_length < sVar1) {
                uVar6 = std::__throw_out_of_range_fmt
                                  ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                   "basic_string::erase",sVar1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                cmsys::Directory::~Directory(&local_70);
                _Unwind_Resume(uVar6);
              }
              local_90._M_dataplus._M_p[sVar1] = '\0';
              local_90._M_string_length = sVar1;
              std::__cxx11::string::append((char *)&local_90);
              bVar3 = AddPath(local_68,local_90._M_dataplus._M_p,local_60,local_58);
              if (!bVar3) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                bVar2 = false;
                goto LAB_0012d26e;
              }
            }
            dindex = dindex + 1;
          } while (uVar5 != dindex);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0012d26e:
      cmsys::Directory::~Directory(&local_70);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path,
                             size_t skip, const char* prefix)
{
  if(!this->AddFile(path, skip, prefix))
    {
    return false;
    }
  if(!cmSystemTools::FileIsDirectory(path) ||
    cmSystemTools::FileIsSymlink(path))
    {
    return true;
    }
  cmsys::Directory d;
  if(d.Load(path))
    {
    std::string next = path;
    next += "/";
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for(unsigned long i = 0; i < n; ++i)
      {
      const char* file = d.GetFile(i);
      if(strcmp(file, ".") != 0 && strcmp(file, "..") != 0)
        {
        next.erase(end);
        next += file;
        if(!this->AddPath(next.c_str(), skip, prefix))
          {
          return false;
          }
        }
      }
    }
  return true;
}